

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O2

void strpool_init(strpool_t *pool,strpool_config_t *config)

{
  int iVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  strpool_internal_hash_slot_t *__s;
  strpool_internal_entry_t *psVar7;
  strpool_internal_handle_t *psVar8;
  strpool_internal_block_t *psVar9;
  strpool_config_t *psVar10;
  
  psVar10 = &strpool_default_config;
  if (config != (strpool_config_t *)0x0) {
    psVar10 = config;
  }
  puVar2 = (undefined8 *)psVar10->memctx;
  pool->memctx = puVar2;
  pool->ignore_case = psVar10->ignore_case;
  iVar6 = psVar10->counter_bits;
  iVar1 = psVar10->index_bits;
  if (0x40 < iVar6 + iVar1) {
    __assert_fail("config->counter_bits + config->index_bits <= 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                  ,0x22b,"void strpool_init(strpool_t *, const strpool_config_t *)");
  }
  pool->counter_shift = iVar1;
  pool->counter_mask = ~(-1L << ((byte)iVar6 & 0x3f));
  pool->index_mask = ~(-1L << ((byte)iVar1 & 0x3f));
  uVar5 = psVar10->entry_capacity;
  if (psVar10->entry_capacity < 3) {
    uVar5 = 2;
  }
  uVar3 = strpool_internal_pow2ceil(uVar5);
  pool->initial_entry_capacity = uVar3;
  uVar5 = 2;
  if (2 < psVar10->block_capacity) {
    uVar5 = psVar10->block_capacity;
  }
  uVar4 = strpool_internal_pow2ceil(uVar5);
  pool->initial_block_capacity = uVar4;
  uVar5 = 0x100;
  if (0x100 < psVar10->block_size) {
    uVar5 = psVar10->block_size;
  }
  uVar5 = strpool_internal_pow2ceil(uVar5);
  pool->block_size = uVar5;
  iVar6 = 0x11;
  if (8 < psVar10->min_length) {
    iVar6 = psVar10->min_length + 9;
  }
  pool->min_data_size = iVar6;
  pool->hash_capacity = uVar3 * 2;
  pool->entry_capacity = uVar3;
  pool->handle_capacity = uVar3;
  pool->block_capacity = uVar4;
  pool->handle_freelist_tail = -1;
  pool->block_count = 0;
  pool->handle_count = 0;
  pool->handle_freelist_head = -1;
  pool->entry_count = 0;
  __s = (strpool_internal_hash_slot_t *)
        (*(code *)*puVar2)(0,(long)(int)(uVar3 * 2) * 0xc,0,0,0,0,puVar2[1]);
  pool->hash_table = __s;
  if (__s != (strpool_internal_hash_slot_t *)0x0) {
    memset(__s,0,(long)pool->hash_capacity * 0xc);
    psVar7 = (strpool_internal_entry_t *)
             (**pool->memctx)(0,(long)pool->entry_capacity << 5,0,0,0,0,
                              *(undefined8 *)((long)pool->memctx + 8));
    pool->entries = psVar7;
    if (psVar7 == (strpool_internal_entry_t *)0x0) {
      __assert_fail("pool->entries",
                    "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                    ,0x24a,"void strpool_init(strpool_t *, const strpool_config_t *)");
    }
    psVar8 = (strpool_internal_handle_t *)
             (**pool->memctx)(0,(long)pool->handle_capacity << 3,0,0,0,0,
                              *(undefined8 *)((long)pool->memctx + 8));
    pool->handles = psVar8;
    if (psVar8 != (strpool_internal_handle_t *)0x0) {
      psVar9 = (strpool_internal_block_t *)
               (**pool->memctx)(0,(long)pool->block_capacity << 5,0,0,0,0,
                                *(undefined8 *)((long)pool->memctx + 8));
      pool->blocks = psVar9;
      if (psVar9 != (strpool_internal_block_t *)0x0) {
        iVar6 = strpool_internal_add_block(pool,pool->block_size);
        pool->current_block = iVar6;
        return;
      }
      __assert_fail("pool->blocks",
                    "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                    ,0x250,"void strpool_init(strpool_t *, const strpool_config_t *)");
    }
    __assert_fail("pool->handles",
                  "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                  ,0x24d,"void strpool_init(strpool_t *, const strpool_config_t *)");
  }
  __assert_fail("pool->hash_table",
                "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                ,0x246,"void strpool_init(strpool_t *, const strpool_config_t *)");
}

Assistant:

void strpool_init( strpool_t* pool, strpool_config_t const* config )
    {
    if( !config ) config = &strpool_default_config;

    pool->memctx = config->memctx;
    pool->ignore_case = config->ignore_case;

    STRPOOL_ASSERT( config->counter_bits + config->index_bits <= 64 );
    pool->counter_shift = config->index_bits;
    pool->counter_mask = ( 1ULL << (STRPOOL_U64) config->counter_bits ) - 1;
    pool->index_mask = ( 1ULL << (STRPOOL_U64) config->index_bits ) - 1;

    pool->initial_entry_capacity = 
        (int) strpool_internal_pow2ceil( config->entry_capacity > 1 ? (STRPOOL_U32)config->entry_capacity : 2U );
    pool->initial_block_capacity = 
        (int) strpool_internal_pow2ceil( config->block_capacity > 1 ? (STRPOOL_U32)config->block_capacity : 2U );
    pool->block_size = 
        (int) strpool_internal_pow2ceil( config->block_size > 256 ? (STRPOOL_U32)config->block_size : 256U );
    pool->min_data_size = 
        (int) ( sizeof( int ) * 2 + 1 + ( config->min_length > 8 ? (STRPOOL_U32)config->min_length : 8U ) );

    pool->hash_capacity = pool->initial_entry_capacity * 2;
    pool->entry_capacity = pool->initial_entry_capacity;
    pool->handle_capacity = pool->initial_entry_capacity;
    pool->block_capacity = pool->initial_block_capacity;    

    pool->handle_freelist_head = -1;
    pool->handle_freelist_tail = -1;
    pool->block_count = 0;
    pool->handle_count = 0;
    pool->entry_count = 0;
    
    pool->hash_table = (strpool_internal_hash_slot_t*) STRPOOL_MALLOC( pool->memctx, 
        pool->hash_capacity * sizeof( *pool->hash_table ) );
    STRPOOL_ASSERT( pool->hash_table );
    STRPOOL_MEMSET( pool->hash_table, 0, pool->hash_capacity * sizeof( *pool->hash_table ) );
    pool->entries = (strpool_internal_entry_t*) STRPOOL_MALLOC( pool->memctx, 
        pool->entry_capacity * sizeof( *pool->entries ) );
    STRPOOL_ASSERT( pool->entries );
    pool->handles = (strpool_internal_handle_t*) STRPOOL_MALLOC( pool->memctx, 
        pool->handle_capacity * sizeof( *pool->handles ) );
    STRPOOL_ASSERT( pool->handles );
    pool->blocks = (strpool_internal_block_t*) STRPOOL_MALLOC( pool->memctx, 
        pool->block_capacity * sizeof( *pool->blocks ) );
    STRPOOL_ASSERT( pool->blocks );

    pool->current_block = strpool_internal_add_block( pool, pool->block_size );
    }